

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O3

void write_failure_test(void)

{
  size_t keylen;
  void *pvVar1;
  kvs_ops_stat *__s1;
  kvs_ops_stat *__s2;
  fdb_custom_cmp_variable __n;
  long lVar2;
  char *pcVar3;
  fdb_status fVar4;
  int iVar5;
  anomalous_callbacks *cbs;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int *piVar9;
  fdb_doc *pfVar10;
  fdb_kvs_handle **ppfVar11;
  undefined4 extraout_EDX;
  long lVar12;
  btree *pbVar13;
  btree *pbVar14;
  char *pcVar15;
  fdb_kvs_handle *doc;
  undefined8 uVar16;
  undefined8 uVar17;
  btree *pbVar18;
  uint uVar19;
  uint uVar20;
  fdb_kvs_handle *pfVar21;
  ulong uVar22;
  size_t asStack_c050 [2];
  ulong uStack_c040;
  btree local_c038 [857];
  undefined1 local_4b0 [8];
  fdb_config fconfig;
  char metabuf [256];
  char bodybuf [256];
  char temp [256];
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fail_ctx_t fail_ctx;
  fdb_file_handle *local_68;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_doc *rdoc;
  char *local_48;
  fdb_kvs_handle *local_40;
  fdb_kvs_handle *local_38;
  
  uStack_c040 = 0x106d5d;
  gettimeofday((timeval *)&kvs_config.custom_cmp_param,(__timezone_ptr_t)0x0);
  uStack_c040 = 0x106d62;
  memleak_start();
  uStack_c040 = 0x106d67;
  cbs = get_default_anon_cbs();
  __test_begin.tv_usec = 0;
  cbs->pwrite_cb = pwrite_failure_cb;
  uStack_c040 = 0x106d8f;
  system("rm -rf  anomaly_test* > errorlog.txt");
  uStack_c040 = 0x106d9a;
  filemgr_ops_anomalous_init(cbs,&__test_begin.tv_usec);
  uStack_c040 = 0x106db1;
  fdb_get_default_config();
  uStack_c040 = 0x106dc0;
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.purging_interval = 1;
  fconfig.wal_threshold._4_4_ = 0;
  fconfig.flags._3_1_ = 0;
  lVar2 = -((long)(int)(local_4b0._4_4_ - 0x100) + 0xfU & 0xfffffffffffffff0);
  pcVar15 = (char *)((long)local_c038 + lVar2);
  *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106e09;
  fdb_open(&local_68,"anomaly_test1",(fdb_config *)local_4b0);
  *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106e19;
  fdb_kvs_open_default(local_68,(fdb_kvs_handle **)&dbfile,(fdb_kvs_config *)(temp + 0xf8));
  uVar19 = local_4b0._4_4_ - 0x101;
  if (0 < (int)uVar19) {
    *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106e35;
    memset(pcVar15,0x5f,(ulong)uVar19);
  }
  pcVar15[(int)uVar19] = '\0';
  pbVar14 = local_c038;
  pfVar10 = (fdb_doc *)0x0;
  lVar12 = 0;
  local_48 = pcVar15;
  do {
    pcVar3 = local_48;
    *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106e76;
    rdoc = pfVar10;
    sprintf(bodybuf + 0xf8,"%08d");
    *(undefined8 *)pcVar3 = bodybuf._248_8_;
    uVar22 = 0;
    pbVar18 = pbVar14;
    do {
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106ea2;
      sprintf(bodybuf + 0xf8,"%08d",uVar22 & 0xffffffff);
      *(undefined8 *)((long)local_c038 + (int)uVar19 + lVar2 + -8) = bodybuf._248_8_;
      uVar20 = (int)rdoc + (int)uVar22;
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106ed2;
      sprintf((char *)&fconfig.num_blocks_readahead,"meta%d",(ulong)uVar20);
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106ee6;
      sprintf(metabuf + 0xf8,"body%d",(ulong)uVar20);
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106eee;
      sVar6 = strlen(pcVar15);
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106efe;
      sVar7 = strlen((char *)&fconfig.num_blocks_readahead);
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106f0e;
      sVar8 = strlen(metabuf + 0xf8);
      *(size_t *)((long)asStack_c050 + lVar2 + 8) = sVar8 + 1;
      *(undefined8 *)((long)asStack_c050 + lVar2) = 0x106f3f;
      fdb_doc_create((fdb_doc **)pbVar18,pcVar15,sVar6 + 1,&fconfig.num_blocks_readahead,sVar7 + 1,
                     metabuf + 0xf8,*(size_t *)((long)asStack_c050 + lVar2 + 8));
      uVar22 = uVar22 + 1;
      pbVar18 = (btree *)&pbVar18->root_bid;
    } while (uVar22 != 0x14);
    lVar12 = lVar12 + 1;
    pbVar14 = (btree *)&pbVar14[2].aux;
    pfVar10 = (fdb_doc *)((long)&rdoc->bodylen + 4);
  } while (lVar12 != 300);
  lVar12 = 0;
  do {
    pfVar10 = *(fdb_doc **)(&local_c038[0].ksize + lVar12 * 8);
    *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106f99;
    fdb_set((fdb_kvs_handle *)dbfile,pfVar10);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 6000);
  *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106fb3;
  fdb_commit(local_68,'\x01');
  lVar12 = 0;
  do {
    keylen = **(size_t **)(&local_c038[0].ksize + lVar12);
    pvVar1 = (void *)(*(size_t **)(&local_c038[0].ksize + lVar12))[4];
    ppfVar11 = (fdb_kvs_handle **)0x0;
    uVar16 = 0;
    uVar17 = 0;
    *(undefined8 *)((long)asStack_c050 + lVar2 + 8) = 0;
    *(undefined8 *)((long)asStack_c050 + lVar2) = 0x106fdf;
    fdb_doc_create((fdb_doc **)&db,pvVar1,keylen,(void *)0x0,0,(void *)0x0,
                   *(size_t *)((long)asStack_c050 + lVar2 + 8));
    *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x106ff0;
    fVar4 = fdb_get((fdb_kvs_handle *)dbfile,(fdb_doc *)db);
    doc = db;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x1070bf;
      fdb_doc_free((fdb_doc *)db);
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x1070c8;
      fdb_close(local_68);
      lVar12 = 0;
      do {
        pfVar10 = *(fdb_doc **)(&local_c038[0].ksize + lVar12 * 8);
        *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x1070d7;
        fdb_doc_free(pfVar10);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 6000);
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x1070e8;
      fdb_shutdown();
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x1070ed;
      memleak_end();
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x107111;
      sprintf(bodybuf + 0xf8,"write failure test: %d failures out of %d writes",
              __test_begin.tv_usec & 0xffffffff,(ulong)__test_begin.tv_usec >> 0x20);
      pcVar15 = "%s PASSED\n";
      if (write_failure_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x10713e;
      fprintf(_stderr,pcVar15,bodybuf + 0xf8);
      return;
    }
    pbVar14 = (btree *)(&local_c038[0].ksize + lVar12);
    sVar6 = *(size_t *)&db->kvs_config;
    __s1 = db->op_stats;
    pfVar21 = *(fdb_kvs_handle **)pbVar14;
    __s2 = pfVar21->op_stats;
    *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x10701c;
    iVar5 = bcmp(__s1,__s2,sVar6);
    if (iVar5 != 0) {
      ppfVar11 = &local_38;
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x10707b;
      write_failure_test();
      doc = local_40;
      pfVar21 = local_38;
    }
    __n = (doc->kvs_config).custom_cmp;
    pbVar18 = doc->staletree;
    pbVar13 = pfVar21->staletree;
    *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x107031;
    iVar5 = bcmp(pbVar18,pbVar13,(size_t)__n);
    if (iVar5 != 0) {
      ppfVar11 = &local_38;
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x107098;
      write_failure_test();
      doc = local_40;
      pfVar21 = local_38;
    }
    pvVar1 = (doc->kvs_config).custom_cmp_param;
    pbVar18 = (doc->field_6).seqtree;
    pbVar13 = (pfVar21->field_6).seqtree;
    *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x107046;
    iVar5 = bcmp(pbVar18,pbVar13,(size_t)pvVar1);
    if (iVar5 != 0) {
      *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x1070b1;
      write_failure_test();
      pbVar13 = pbVar14;
      doc = local_38;
    }
    *(undefined8 *)((long)local_c038 + lVar2 + -8) = 0x107052;
    fdb_doc_free((fdb_doc *)doc);
    lVar12 = lVar12 + 8;
  } while (lVar12 != 48000);
  *(code **)((long)local_c038 + lVar2 + -8) = pread_failure_cb;
  write_failure_test();
  uVar19 = *(uint *)&(doc->kvs_config).field_0x4;
  *(uint *)&(doc->kvs_config).field_0x4 = uVar19 + 1;
  if ((int)uVar19 < *(int *)&(doc->kvs_config).custom_cmp) {
    (*(code *)pbVar13->blk_handle)(extraout_EDX,ppfVar11,uVar16,uVar17);
    return;
  }
  *(ulong *)((long)local_c038 + lVar2 + -8) = (ulong)uVar19;
  *(int *)&doc->kvs_config = *(int *)&doc->kvs_config + 1;
  *(undefined8 *)((long)asStack_c050 + lVar2 + 8) = 0x10717b;
  piVar9 = __errno_location();
  *piVar9 = -2;
  return;
}

Assistant:

void write_failure_test()
{
    TEST_INIT();

    memleak_start();

    int i, j, idx, r;
    int n=300, m=20; // n: # prefixes, m: # postfixes
    int keylen_limit;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n*m);
    fdb_doc *rdoc;
    fdb_status status;
    int anomaly_hit = 0;

    char *keybuf;
    char metabuf[256], bodybuf[256], temp[256];
    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *write_fail_cb = get_default_anon_cbs();
    fail_ctx_t fail_ctx;
    memset(&fail_ctx, 0, sizeof(fail_ctx_t));
    // Modify the pwrite callback to redirect to test-specific function
    write_fail_cb->pwrite_cb = &pwrite_failure_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    // Reset anomalous behavior stats..
    filemgr_ops_anomalous_init(write_fail_cb, &fail_ctx);

    // The number indicates the count after which all writes begin to fail
    // This number is unique to this test suite and can cause a segmentation
    // fault if the underlying fixed issue resurfaces
    fail_ctx.start_failing_after = 10112;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    keylen_limit = fconfig.blocksize - 256;
    keybuf = alca(char, keylen_limit);

    // open db
    fdb_open(&dbfile, "anomaly_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // key structure:
    // <------------ <keylen_limit> bytes ------------->
    // <-- 8 bytes -->             <-- 8 bytes  -->< 1 >
    // [prefix number]____ ... ____[postfix number][ \0]
    // e.g.)
    // 00000001____ ... ____00000013[\0]

    // create docs
    for (i=0;i<keylen_limit-1;++i){
        keybuf[i] = '_';
    }
    keybuf[keylen_limit-1] = 0;

    for (i=0;i<n;++i){
        // set prefix
        sprintf(temp, "%08d", i);
        memcpy(keybuf, temp, 8);
        for (j=0;j<m;++j){
            idx = i*m + j;
            // set postfix
            sprintf(temp, "%08d", j);
            memcpy(keybuf + (keylen_limit-1) - 8, temp, 8);
            sprintf(metabuf, "meta%d", idx);
            sprintf(bodybuf, "body%d", idx);
            fdb_doc_create(&doc[idx], (void*)keybuf, strlen(keybuf)+1,
                                    (void*)metabuf, strlen(metabuf)+1,
                                    (void*)bodybuf, strlen(bodybuf)+1);
        }
    }

    // insert docs
    for (i=0;i<n*m;++i) {
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // retrieval check
    for (i=0;i<n*m;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (status != FDB_RESULT_SUCCESS) {
            fdb_doc_free(rdoc);
            anomaly_hit = 1;
            break;
        }
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->key, doc[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
    }
    TEST_CHK(anomaly_hit);

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n*m;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(temp, "write failure test: %d failures out of %d writes",
            fail_ctx.num_fails, fail_ctx.num_ops);

    TEST_RESULT(temp);
}